

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O2

bool __thiscall draco::ObjEncoder::GetAddedEdges(ObjEncoder *this)

{
  GeometryMetadata *this_00;
  AttributeMetadata *pAVar1;
  PointAttribute *pPVar2;
  byte in_CL;
  allocator<char> local_52;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  this_00 = (this->in_mesh_->super_PointCloud).metadata_._M_t.
            super___uniq_ptr_impl<draco::GeometryMetadata,_std::default_delete<draco::GeometryMetadata>_>
            ._M_t.
            super__Tuple_impl<0UL,_draco::GeometryMetadata_*,_std::default_delete<draco::GeometryMetadata>_>
            .super__Head_base<0UL,_draco::GeometryMetadata_*,_false>._M_head_impl;
  if (this_00 == (GeometryMetadata *)0x0) {
    in_CL = 1;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"name",&local_51);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"added_edges",&local_52);
    pAVar1 = GeometryMetadata::GetAttributeMetadataByStringEntry(this_00,&local_30,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    if (pAVar1 != (AttributeMetadata *)0x0) {
      pPVar2 = PointCloud::GetAttributeByUniqueId
                         (&this->in_mesh_->super_PointCloud,pAVar1->att_unique_id_);
      if (((pPVar2->num_unique_entries_ == 0) ||
          ((pPVar2->super_GeometryAttribute).num_components_ != '\x01')) ||
         ((pPVar2->super_GeometryAttribute).data_type_ != DT_UINT8)) {
        in_CL = 0;
      }
      else {
        this->added_edges_att_ = pPVar2;
        in_CL = 1;
      }
    }
    in_CL = pAVar1 == (AttributeMetadata *)0x0 | in_CL;
  }
  return (bool)(in_CL & 1);
}

Assistant:

bool ObjEncoder::GetAddedEdges() {
  const GeometryMetadata *mesh_metadata = in_mesh_->GetMetadata();
  if (!mesh_metadata) {
    return true;
  }

  // Try to get a per-corner attribute describing added edges.
  {
    const AttributeMetadata *att_metadata =
        mesh_metadata->GetAttributeMetadataByStringEntry("name", "added_edges");
    if (att_metadata) {
      const auto att =
          in_mesh_->GetAttributeByUniqueId(att_metadata->att_unique_id());
      if (att->size() == 0 || att->num_components() != 1 ||
          att->data_type() != DataType::DT_UINT8) {
        return false;
      }
      added_edges_att_ = att;
      return true;
    }
  }

  return true;
}